

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::visitConst(I64ToI32Lowering *this,Const *curr)

{
  Builder *pBVar1;
  Builder *this_00;
  Index index;
  int64_t iVar2;
  Const *value;
  LocalSet *any;
  Block *e;
  undefined1 local_58 [8];
  TempVar highBits;
  
  if (((this->
       super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
       ).super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
       super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
       currFunction != (Function *)0x0) &&
     ((curr->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id == 3)) {
    getTemp((TempVar *)local_58,this,(Type)0x2);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    iVar2 = Literal::geti64(&curr->value);
    highBits.ty.id = (uintptr_t)Builder::makeConst<int>(pBVar1,(int)iVar2);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    index = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
    this_00 = (this->builder)._M_t.
              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
              super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    iVar2 = Literal::geti64(&curr->value);
    value = Builder::makeConst<int>(this_00,(int)((ulong)iVar2 >> 0x20));
    any = Builder::makeLocalSet(pBVar1,index,(Expression *)value);
    e = Builder::blockify((this->builder)._M_t.
                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                          .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                          (Expression *)any,(Expression *)highBits.ty.id);
    setOutParam(this,(Expression *)e,(TempVar *)local_58);
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
               (Expression *)e);
    TempVar::~TempVar((TempVar *)local_58);
  }
  return;
}

Assistant:

void visitConst(Const* curr) {
    if (!getFunction()) {
      return; // if in a global init, skip - we already handled that.
    }
    if (curr->type != Type::i64) {
      return;
    }
    TempVar highBits = getTemp();
    Const* lowVal =
      builder->makeConst(int32_t(curr->value.geti64() & 0xffffffff));
    LocalSet* setHigh = builder->makeLocalSet(
      highBits,
      builder->makeConst(int32_t(uint64_t(curr->value.geti64()) >> 32)));
    Block* result = builder->blockify(setHigh, lowVal);
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }